

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O0

void __thiscall Rml::ElementDocument::ProcessDefaultAction(ElementDocument *this,Event *event)

{
  Event *pEVar1;
  bool bVar2;
  TabIndex TVar3;
  int iVar4;
  Element *pEVar5;
  ComputedValues *this_00;
  Element *focus_node_1;
  Element *local_c0;
  Element *next;
  Property *nav_property;
  Element *focus_node;
  anon_class_8_1_8991fb9c GetNearestFocusable;
  NavigationSearchDirection local_98;
  undefined1 auStack_94 [3];
  PropertyId property_id;
  NavigationSearchDirection direction;
  bool local_82;
  allocator<char> local_81;
  String local_80;
  Element *local_60;
  Element *element;
  allocator<char> local_41;
  String local_40;
  int local_1c;
  Event *pEStack_18;
  int key_identifier;
  Event *event_local;
  ElementDocument *this_local;
  
  pEStack_18 = event;
  event_local = (Event *)this;
  Element::ProcessDefaultAction(&this->super_Element,event);
  bVar2 = Event::operator==(pEStack_18,Keydown);
  pEVar1 = pEStack_18;
  if (bVar2) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"key_identifier",&local_41);
    element._0_4_ = 0;
    iVar4 = Event::GetParameter<int>(pEVar1,&local_40,(int *)&element);
    ::std::__cxx11::string::~string((string *)&local_40);
    ::std::allocator<char>::~allocator(&local_41);
    local_1c = iVar4;
    if (iVar4 == 0x46) {
      pEVar5 = Event::GetTargetElement(pEStack_18);
      pEVar1 = pEStack_18;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"shift_key",&local_81);
      local_82 = false;
      bVar2 = Event::GetParameter<bool>(pEVar1,&local_80,&local_82);
      pEVar5 = FindNextTabElement(this,pEVar5,(bool)(~bVar2 & 1));
      ::std::__cxx11::string::~string((string *)&local_80);
      ::std::allocator<char>::~allocator(&local_81);
      if ((pEVar5 != (Element *)0x0) &&
         (local_60 = pEVar5, bVar2 = Element::Focus(pEVar5,true), pEVar5 = local_60, bVar2)) {
        ScrollIntoViewOptions::ScrollIntoViewOptions
                  ((ScrollIntoViewOptions *)auStack_94,Nearest,Nearest,Instant,All);
        Element::ScrollIntoView(pEVar5,_auStack_94);
        Event::StopPropagation(pEStack_18);
      }
    }
    else if ((((iVar4 == 0x5a) || (iVar4 == 0x5c)) || (iVar4 == 0x5b)) || (iVar4 == 0x5d)) {
      local_98 = Up;
      GetNearestFocusable.this._7_1_ = NavLeft;
      switch(iVar4) {
      case 0x5a:
        local_98 = Left;
        GetNearestFocusable.this._7_1_ = NavLeft;
        break;
      case 0x5b:
        local_98 = Up;
        GetNearestFocusable.this._7_1_ = NavUp;
        break;
      case 0x5c:
        local_98 = Right;
        GetNearestFocusable.this._7_1_ = NavRight;
        break;
      case 0x5d:
        local_98 = Down;
        GetNearestFocusable.this._7_1_ = NavDown;
      }
      focus_node = &this->super_Element;
      pEVar5 = Element::GetFocusLeafNode(&this->super_Element);
      nav_property = (Property *)
                     ProcessDefaultAction::anon_class_8_1_8991fb9c::operator()
                               ((anon_class_8_1_8991fb9c *)&focus_node,pEVar5);
      next = (Element *)
             Element::GetLocalProperty((Element *)nav_property,GetNearestFocusable.this._7_1_);
      if (((next != (Element *)0x0) &&
          (local_c0 = FindNextNavigationElement
                                (this,(Element *)nav_property,local_98,(Property *)next),
          local_c0 != (Element *)0x0)) &&
         (bVar2 = Element::Focus(local_c0,true), pEVar5 = local_c0, bVar2)) {
        ScrollIntoViewOptions::ScrollIntoViewOptions
                  ((ScrollIntoViewOptions *)&focus_node_1,Nearest,Nearest,Instant,All);
        Element::ScrollIntoView(pEVar5,_focus_node_1);
        Event::StopPropagation(pEStack_18);
      }
    }
    else if ((((iVar4 == 0x48) || (iVar4 == 0x3d)) || (iVar4 == 1)) &&
            (pEVar5 = Element::GetFocusLeafNode(&this->super_Element), pEVar5 != (Element *)0x0)) {
      this_00 = Element::GetComputedValues(pEVar5);
      TVar3 = Style::ComputedValues::tab_index(this_00);
      if (TVar3 == Auto) {
        Element::Click(pEVar5);
        Event::StopPropagation(pEStack_18);
      }
    }
  }
  return;
}

Assistant:

void ElementDocument::ProcessDefaultAction(Event& event)
{
	Element::ProcessDefaultAction(event);

	// Process generic keyboard events for this window in bubble phase
	if (event == EventId::Keydown)
	{
		int key_identifier = event.GetParameter<int>("key_identifier", Input::KI_UNKNOWN);

		// Process TAB
		if (key_identifier == Input::KI_TAB)
		{
			if (Element* element = FindNextTabElement(event.GetTargetElement(), !event.GetParameter<bool>("shift_key", false)))
			{
				if (element->Focus(true))
				{
					element->ScrollIntoView(ScrollAlignment::Nearest);
					event.StopPropagation();
				}
			}
		}
		// Process direction keys
		else if (key_identifier == Input::KI_LEFT || key_identifier == Input::KI_RIGHT || key_identifier == Input::KI_UP ||
			key_identifier == Input::KI_DOWN)
		{
			NavigationSearchDirection direction = {};
			PropertyId property_id = PropertyId::NavLeft;
			switch (key_identifier)
			{
			case Input::KI_LEFT:
				direction = NavigationSearchDirection::Left;
				property_id = PropertyId::NavLeft;
				break;
			case Input::KI_RIGHT:
				direction = NavigationSearchDirection::Right;
				property_id = PropertyId::NavRight;
				break;
			case Input::KI_UP:
				direction = NavigationSearchDirection::Up;
				property_id = PropertyId::NavUp;
				break;
			case Input::KI_DOWN:
				direction = NavigationSearchDirection::Down;
				property_id = PropertyId::NavDown;
				break;
			}

			auto GetNearestFocusable = [this](Element* focus_node) -> Element* {
				while (focus_node)
				{
					if (CanFocusElement(focus_node) == CanFocus::Yes)
						break;
					focus_node = focus_node->GetParentNode();
				}
				return focus_node ? focus_node : this;
			};
			Element* focus_node = GetNearestFocusable(GetFocusLeafNode());
			if (const Property* nav_property = focus_node->GetLocalProperty(property_id))
			{
				if (Element* next = FindNextNavigationElement(focus_node, direction, *nav_property))
				{
					if (next->Focus(true))
					{
						next->ScrollIntoView(ScrollAlignment::Nearest);
						event.StopPropagation();
					}
				}
			}
		}
		// Process ENTER being pressed on a focusable object (emulate click)
		else if (key_identifier == Input::KI_RETURN || key_identifier == Input::KI_NUMPADENTER || key_identifier == Input::KI_SPACE)
		{
			Element* focus_node = GetFocusLeafNode();

			if (focus_node && focus_node->GetComputedValues().tab_index() == Style::TabIndex::Auto)
			{
				focus_node->Click();
				event.StopPropagation();
			}
		}
	}
}